

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  long lVar17;
  long lVar18;
  int k;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  
  auVar5 = vpmovsxbq_avx(ZEXT216(0xa05));
  auVar6 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
  auVar7 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
  auVar8 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
  uVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  iVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
  lVar17 = (long)endPattern;
  iVar16 = startPattern * 4;
  for (uVar20 = 0; uVar20 != (~((int)uVar2 >> 0x1f) & uVar2); uVar20 = uVar20 + 1) {
    lVar18 = (long)iVar16;
    auVar21 = vpbroadcastq_avx512vl();
    auVar4 = vpaddq_avx(auVar21._0_16_,auVar5);
    auVar22 = vpbroadcastq_avx512vl();
    vpaddq_avx2(auVar21,auVar6);
    vpaddq_avx2(auVar21,auVar7);
    vpaddq_avx2(auVar21,auVar8);
    auVar23 = vpermq_avx2(ZEXT1632(auVar4),0xd0);
    auVar23 = vpblendd_avx2(auVar23,auVar21,3);
    vpblendd_avx2(auVar23,auVar22,0xc0);
    auVar23 = vgatherqpd_avx512vl(matrices1[(long)matrices2]);
    auVar21 = vgatherqpd_avx512vl(matrices1[(long)scaleFactors]);
    auVar22 = vgatherqpd_avx512vl(matrices1[lVar17]);
    auVar24 = vgatherqpd_avx512vl(matrices1[lVar18]);
    auVar25 = vgatherqpd_avx512vl(*(undefined8 *)((long)matrices2 * 9));
    auVar26 = vgatherqpd_avx512vl(matrices2[(long)scaleFactors]);
    auVar27 = vgatherqpd_avx512vl(matrices2[lVar17]);
    auVar28 = vgatherqpd_avx512vl(matrices2[lVar18]);
    for (lVar19 = (long)startPattern; lVar19 < lVar17; lVar19 = lVar19 + 1) {
      dVar1 = partials1[lVar18 + 1];
      auVar29._8_8_ = dVar1;
      auVar29._0_8_ = dVar1;
      auVar29._16_8_ = dVar1;
      auVar29._24_8_ = dVar1;
      auVar29 = vmulpd_avx512vl(auVar21,auVar29);
      dVar1 = partials2[lVar18 + 1];
      auVar30._8_8_ = dVar1;
      auVar30._0_8_ = dVar1;
      auVar30._16_8_ = dVar1;
      auVar30._24_8_ = dVar1;
      auVar30 = vmulpd_avx512vl(auVar26,auVar30);
      dVar1 = partials1[lVar18];
      auVar9._8_8_ = dVar1;
      auVar9._0_8_ = dVar1;
      auVar9._16_8_ = dVar1;
      auVar9._24_8_ = dVar1;
      auVar29 = vfmadd231pd_avx512vl(auVar29,auVar23,auVar9);
      dVar1 = partials2[lVar18];
      auVar10._8_8_ = dVar1;
      auVar10._0_8_ = dVar1;
      auVar10._16_8_ = dVar1;
      auVar10._24_8_ = dVar1;
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar25,auVar10);
      dVar1 = partials1[lVar18 + 2];
      auVar11._8_8_ = dVar1;
      auVar11._0_8_ = dVar1;
      auVar11._16_8_ = dVar1;
      auVar11._24_8_ = dVar1;
      auVar29 = vfmadd231pd_avx512vl(auVar29,auVar22,auVar11);
      dVar1 = partials2[lVar18 + 2];
      auVar12._8_8_ = dVar1;
      auVar12._0_8_ = dVar1;
      auVar12._16_8_ = dVar1;
      auVar12._24_8_ = dVar1;
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar27,auVar12);
      dVar1 = partials1[lVar18 + 3];
      auVar13._8_8_ = dVar1;
      auVar13._0_8_ = dVar1;
      auVar13._16_8_ = dVar1;
      auVar13._24_8_ = dVar1;
      auVar29 = vfmadd231pd_avx512vl(auVar29,auVar24,auVar13);
      dVar1 = partials2[lVar18 + 3];
      auVar14._8_8_ = dVar1;
      auVar14._0_8_ = dVar1;
      auVar14._16_8_ = dVar1;
      auVar14._24_8_ = dVar1;
      auVar30 = vfmadd231pd_avx512vl(auVar30,auVar28,auVar14);
      auVar31._0_8_ = auVar29._0_8_ * auVar30._0_8_;
      auVar31._8_8_ = auVar29._8_8_ * auVar30._8_8_;
      auVar31._16_8_ = auVar29._16_8_ * auVar30._16_8_;
      auVar31._24_8_ = auVar29._24_8_ * auVar30._24_8_;
      dVar1 = scaleFactors[lVar19];
      auVar15._8_8_ = dVar1;
      auVar15._0_8_ = dVar1;
      auVar15._16_8_ = dVar1;
      auVar15._24_8_ = dVar1;
      auVar29 = vdivpd_avx512vl(auVar31,auVar15);
      *(undefined1 (*) [32])(destP + lVar18) = auVar29;
      lVar18 = lVar18 + 4;
    }
    iVar16 = iVar16 + iVar3 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                               const REALTYPE* partials1,
                                                                               const REALTYPE* matrices1,
                                                                               const REALTYPE* partials2,
                                                                               const REALTYPE* matrices2,
                                                                               const REALTYPE* scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            // Prefetch scale factor
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20 / scaleFactor;
            destP[u + 1] = sum11 * sum21 / scaleFactor;
            destP[u + 2] = sum12 * sum22 / scaleFactor;
            destP[u + 3] = sum13 * sum23 / scaleFactor;

            u += 4;
        }
    }
}